

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::doAddCols(SPxLPBase<double> *this,LPColSetBase<double> *set,bool scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  SVectorBase<double> *pSVar5;
  char *pcVar6;
  double *pdVar7;
  SVectorBase<double> *this_00;
  byte in_DL;
  int __c;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  undefined8 extraout_RDX_02;
  long *in_RSI;
  long *in_RDI;
  Real RVar9;
  int idx;
  SVectorBase<double> *row;
  int k_1;
  DataArray<int> *rowscaleExp;
  int newColScaleExp;
  SVectorBase<double> *vec_1;
  int len;
  int k;
  LPRowBase<double> empty;
  int l;
  SVectorBase<double> *vec;
  DataArray<int> newRows;
  int oldRowNumber;
  int oldColNumber;
  int j;
  int i;
  int in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  LPRowBase<double> *in_stack_fffffffffffffde8;
  double dVar10;
  LPRowSetBase<double> *in_stack_fffffffffffffdf0;
  LPColSetBase<double> *in_stack_fffffffffffffe28;
  DataArray<int> *this_01;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int iVar11;
  int local_9c;
  DataArray<int> local_40;
  int local_24;
  int local_20;
  uint local_1c;
  int local_18;
  byte local_11;
  long *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_20 = nCols((SPxLPBase<double> *)0x26e047);
  local_24 = nRows((SPxLPBase<double> *)0x26e05b);
  nRows((SPxLPBase<double> *)0x26e06f);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_fffffffffffffdf0,
             (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(int)in_stack_fffffffffffffde8,
             (Real)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  if (local_10 != in_RDI + 0x19) {
    LPColSetBase<double>::add
              ((LPColSetBase<double> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
               ,in_stack_fffffffffffffe28);
  }
  local_18 = nRows((SPxLPBase<double> *)0x26e0ea);
  while (local_18 = local_18 + -1, -1 < local_18) {
    piVar4 = DataArray<int>::operator[](&local_40,local_18);
    *piVar4 = 0;
  }
  local_18 = LPColSetBase<double>::num((LPColSetBase<double> *)0x26e148);
  while (local_18 = local_18 + -1, -1 < local_18) {
    pSVar5 = LPColSetBase<double>::colVector
                       ((LPColSetBase<double> *)
                        CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                        in_stack_fffffffffffffddc);
    local_1c = SVectorBase<double>::size(pSVar5);
    uVar8 = extraout_RDX;
    while (local_1c = local_1c - 1, -1 < (int)local_1c) {
      pcVar6 = SVectorBase<double>::index(pSVar5,(char *)(ulong)local_1c,(int)uVar8);
      iVar2 = (int)pcVar6;
      iVar1 = nRows((SPxLPBase<double> *)0x26e1f9);
      if (iVar1 <= iVar2) {
        LPRowBase<double>::LPRowBase
                  ((LPRowBase<double> *)
                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   in_stack_fffffffffffffddc);
        DataArray<int>::reSize
                  ((DataArray<int> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   in_stack_fffffffffffffddc);
        for (local_9c = nRows((SPxLPBase<double> *)0x26e24e); local_9c <= iVar2;
            local_9c = local_9c + 1) {
          piVar4 = DataArray<int>::operator[](&local_40,local_9c);
          *piVar4 = 0;
          LPRowSetBase<double>::add(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        }
        LPRowBase<double>::~LPRowBase((LPRowBase<double> *)0x26e2ee);
      }
      piVar4 = DataArray<int>::operator[](&local_40,iVar2);
      *piVar4 = *piVar4 + 1;
      uVar8 = extraout_RDX_00;
    }
  }
  for (local_18 = 0; iVar2 = local_18, iVar1 = nRows((SPxLPBase<double> *)0x26e35d), iVar2 < iVar1;
      local_18 = local_18 + 1) {
    piVar4 = DataArray<int>::operator[](&local_40,local_18);
    if (0 < *piVar4) {
      piVar4 = DataArray<int>::operator[](&local_40,local_18);
      iVar2 = *piVar4;
      pSVar5 = rowVector((SPxLPBase<double> *)
                         CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffddc);
      iVar1 = SVectorBase<double>::size(pSVar5);
      LPRowSetBase<double>::xtend
                ((LPRowSetBase<double> *)
                 CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8);
      pSVar5 = rowVector_w((SPxLPBase<double> *)
                           CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                           in_stack_fffffffffffffddc);
      SVectorBase<double>::set_size(pSVar5,iVar2 + iVar1);
    }
  }
  for (local_18 = local_20; iVar2 = local_18, iVar1 = nCols((SPxLPBase<double> *)0x26e483),
      iVar2 < iVar1; local_18 = local_18 + 1) {
    if ((int)in_RDI[0x32] == 1) {
      pdVar7 = LPColSetBase<double>::maxObj_w
                         ((LPColSetBase<double> *)
                          CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                          in_stack_fffffffffffffddc);
      *pdVar7 = *pdVar7 * 1.0;
    }
    else {
      pdVar7 = LPColSetBase<double>::maxObj_w
                         ((LPColSetBase<double> *)
                          CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                          in_stack_fffffffffffffddc);
      *pdVar7 = *pdVar7 * -1.0;
    }
    pSVar5 = colVector_w((SPxLPBase<double> *)
                         CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffddc);
    if ((local_11 & 1) != 0) {
      iVar2 = (**(code **)(*(long *)in_RDI[0x35] + 8))
                        ((long *)in_RDI[0x35],pSVar5,(DataArray<int> *)(in_RDI + 0x16));
      pdVar7 = upper((SPxLPBase<double> *)
                     CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffddc);
      dVar10 = *pdVar7;
      pdVar7 = (double *)infinity();
      if (dVar10 < *pdVar7) {
        upper_w((SPxLPBase<double> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                in_stack_fffffffffffffddc);
        RVar9 = spxLdexp((Real)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffddc);
        pdVar7 = upper_w((SPxLPBase<double> *)
                         CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffddc);
        *pdVar7 = RVar9;
      }
      pdVar7 = lower((SPxLPBase<double> *)
                     CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffddc);
      dVar10 = *pdVar7;
      pdVar7 = (double *)infinity();
      if (-*pdVar7 < dVar10) {
        lower_w((SPxLPBase<double> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                in_stack_fffffffffffffddc);
        RVar9 = spxLdexp((Real)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffddc);
        pdVar7 = lower_w((SPxLPBase<double> *)
                         CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffddc);
        *pdVar7 = RVar9;
      }
      maxObj_w((SPxLPBase<double> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffddc);
      RVar9 = spxLdexp((Real)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffddc);
      pdVar7 = maxObj_w((SPxLPBase<double> *)
                        CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                        in_stack_fffffffffffffddc);
      *pdVar7 = RVar9;
      piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x2f),local_18);
      *piVar4 = iVar2;
    }
    local_1c = SVectorBase<double>::size(pSVar5);
    uVar8 = extraout_RDX_01;
    while (local_1c = local_1c - 1, -1 < (int)local_1c) {
      piVar4 = (int *)SVectorBase<double>::index(pSVar5,(char *)(ulong)local_1c,(int)uVar8);
      iVar2 = *piVar4;
      this_00 = rowVector_w((SPxLPBase<double> *)
                            CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                            in_stack_fffffffffffffddc);
      iVar3 = SVectorBase<double>::size(this_00);
      this_01 = &local_40;
      piVar4 = DataArray<int>::operator[](this_01,iVar2);
      iVar1 = *piVar4;
      piVar4 = DataArray<int>::operator[](this_01,iVar2);
      *piVar4 = *piVar4 + -1;
      iVar11 = local_18;
      piVar4 = (int *)SVectorBase<double>::index(this_00,(char *)(ulong)(uint)(iVar3 - iVar1),__c);
      *piVar4 = iVar11;
      if ((local_11 & 1) != 0) {
        SVectorBase<double>::value(pSVar5,local_1c);
        DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x16),iVar2);
        RVar9 = spxLdexp((Real)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffddc);
        pdVar7 = SVectorBase<double>::value(pSVar5,local_1c);
        *pdVar7 = RVar9;
      }
      pdVar7 = SVectorBase<double>::value(pSVar5,local_1c);
      dVar10 = *pdVar7;
      pdVar7 = SVectorBase<double>::value(this_00,iVar3 - iVar1);
      *pdVar7 = dVar10;
      uVar8 = extraout_RDX_02;
    }
  }
  iVar2 = nCols((SPxLPBase<double> *)0x26ea28);
  (**(code **)(*in_RDI + 0x288))(in_RDI,iVar2 - local_20);
  iVar1 = nRows((SPxLPBase<double> *)0x26ea5e);
  (**(code **)(*in_RDI + 0x280))(in_RDI,iVar1 - local_24);
  DataArray<int>::~DataArray((DataArray<int> *)CONCAT44(iVar2,iVar1));
  return;
}

Assistant:

void doAddCols(const LPColSetBase<R>& set, bool scale = false)
   {
      int i, j;
      int oldColNumber = nCols();
      int oldRowNumber = nRows();
      DataArray < int > newRows(nRows());

      if(&set != this)
         LPColSetBase<R>::add(set);

      assert(LPColSetBase<R>::isConsistent());
      assert(LPRowSetBase<R>::isConsistent());

      // count additional nonzeros per row
      for(i = nRows() - 1; i >= 0; --i)
         newRows[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.colVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new rows if required
            int l = vec.index(j);

            if(l >= nRows())
            {
               LPRowBase<R> empty;
               newRows.reSize(l + 1);

               for(int k = nRows(); k <= l; ++k)
               {
                  newRows[k] = 0;
                  LPRowSetBase<R>::add(empty);
               }

            }

            assert(l < nRows());
            newRows[l]++;
         }
      }

      // extend rows as required
      for(i = 0; i < nRows(); ++i)
      {
         if(newRows[i] > 0)
         {
            int len = newRows[i] + rowVector(i).size();
            LPRowSetBase<R>::xtend(i, len);
            rowVector_w(i).set_size(len);
         }
      }

      // insert new elements to row file
      for(i = oldColNumber; i < nCols(); ++i)
      {
         // @todo: Is there a better way to write the following if, else?
         if(thesense == MAXIMIZE)
         {
            LPColSetBase<R>::maxObj_w(i) *= 1;
         }
         else                  // thesense is MINIMIZE = -1
         {
            LPColSetBase<R>::maxObj_w(i) *= -1;
         }

         SVectorBase<R>& vec = colVector_w(i);
         int newColScaleExp = 0;

         DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

         // compute new column scaling factor and apply it to the bounds
         if(scale)
         {
            newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

            if(upper(i) < R(infinity))
               upper_w(i) = spxLdexp(upper_w(i), - newColScaleExp);

            if(lower(i) > R(-infinity))
               lower_w(i) = spxLdexp(lower_w(i), - newColScaleExp);

            maxObj_w(i) = spxLdexp(maxObj_w(i), newColScaleExp);

            LPColSetBase<R>::scaleExp[i] = newColScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            SVectorBase<R>& row = rowVector_w(k);
            int idx = row.size() - newRows[k];
            assert(newRows[k] > 0);
            newRows[k]--;
            row.index(idx) = i;

            // apply new column and existing row scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[k]);

            row.value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nRows(); ++i)
         assert(newRows[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nCols() - oldColNumber);
      addedCols(nCols() - oldColNumber);
      addedRows(nRows() - oldRowNumber);
   }